

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

EdgeIter __thiscall CMU462::HalfedgeMesh::flipEdge(HalfedgeMesh *this,EdgeIter e0)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer this_00;
  HalfedgeIter *pHVar7;
  pointer pHVar8;
  pointer pVVar9;
  pointer pFVar10;
  VertexIter *pVVar11;
  VertexIter *pVVar12;
  FaceIter *pFVar13;
  FaceIter *pFVar14;
  _List_node_base *in_RSI;
  HalfedgeIter h2_prev;
  HalfedgeIter h1_prev;
  HalfedgeIter h2_next_next;
  HalfedgeIter h2_next;
  HalfedgeIter h1_next_next;
  HalfedgeIter h1_next;
  HalfedgeIter h2;
  HalfedgeIter h1;
  HalfedgeIter in_stack_ffffffffffffff78;
  _List_iterator<CMU462::Halfedge> *in_stack_ffffffffffffff80;
  
  this_00 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x24548b);
  pHVar7 = Edge::halfedge(this_00);
  p_Var1 = pHVar7->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pHVar7 = Halfedge::twin(pHVar8);
  p_Var2 = pHVar7->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pHVar7 = Halfedge::next(pHVar8);
  p_Var3 = pHVar7->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  Halfedge::next(pHVar8);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pHVar7 = Halfedge::next(pHVar8);
  p_Var4 = pHVar7->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pHVar7 = Halfedge::next(pHVar8);
  p_Var5 = pHVar7->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  Halfedge::next(pHVar8);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pHVar7 = Halfedge::next(pHVar8);
  p_Var6 = pHVar7->_M_node;
  prev_Halfedge(in_stack_ffffffffffffff78);
  prev_Halfedge(in_stack_ffffffffffffff78);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  Halfedge::vertex(pHVar8);
  pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff80);
  pHVar7 = Vertex::halfedge(pVVar9);
  pHVar7->_M_node = p_Var5;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  Halfedge::vertex(pHVar8);
  pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff80);
  pHVar7 = Vertex::halfedge(pVVar9);
  pHVar7->_M_node = p_Var3;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  Halfedge::face(pHVar8);
  pFVar10 = std::_List_iterator<CMU462::Face>::operator->
                      ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff80);
  pHVar7 = Face::halfedge(pFVar10);
  pHVar7->_M_node = p_Var1;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  Halfedge::face(pHVar8);
  pFVar10 = std::_List_iterator<CMU462::Face>::operator->
                      ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff80);
  pHVar7 = Face::halfedge(pFVar10);
  pHVar7->_M_node = p_Var2;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pVVar11 = Halfedge::vertex(pHVar8);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pVVar12 = Halfedge::vertex(pHVar8);
  pVVar12->_M_node = pVVar11->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(in_stack_ffffffffffffff80);
  pVVar11 = Halfedge::vertex(pHVar8);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pVVar12 = Halfedge::vertex(pHVar8);
  pVVar12->_M_node = ((_List_iterator<CMU462::Halfedge> *)pVVar11)->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pHVar7 = Halfedge::next(pHVar8);
  pHVar7->_M_node = p_Var4;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pHVar7 = Halfedge::next(pHVar8);
  pHVar7->_M_node = p_Var5;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pHVar7 = Halfedge::next(pHVar8);
  pHVar7->_M_node = p_Var1;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pHVar7 = Halfedge::next(pHVar8);
  pHVar7->_M_node = p_Var6;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pHVar7 = Halfedge::next(pHVar8);
  pHVar7->_M_node = p_Var3;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pHVar7 = Halfedge::next(pHVar8);
  pHVar7->_M_node = p_Var2;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pFVar13 = Halfedge::face(pHVar8);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pFVar14 = Halfedge::face(pHVar8);
  pFVar14->_M_node = pFVar13->_M_node;
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pFVar13 = Halfedge::face(pHVar8);
  pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)pVVar11);
  pFVar14 = Halfedge::face(pHVar8);
  pFVar14->_M_node = pFVar13->_M_node;
  return (EdgeIter)in_RSI;
}

Assistant:

EdgeIter HalfedgeMesh::flipEdge(EdgeIter e0) {
	// TODO: (meshEdit)
	// This method should flip the given edge and return an iterator to the
	// flipped edge.

	HalfedgeIter h1 = e0->halfedge();
	HalfedgeIter h2 = h1->twin();
	HalfedgeIter h1_next = h1->next();
	HalfedgeIter h1_next_next = h1->next()->next();
	HalfedgeIter h2_next = h2->next();
	HalfedgeIter h2_next_next = h2->next()->next();
	HalfedgeIter h1_prev = prev_Halfedge(h1);
	HalfedgeIter h2_prev = prev_Halfedge(h2);

	h1->vertex()->halfedge() = h2_next;
	h2->vertex()->halfedge() = h1_next;
	h1->face()->halfedge() = h1;
	h2->face()->halfedge() = h2;

	h1->vertex() = h2_next_next->vertex();
	h2->vertex() = h1_next_next->vertex();

	h1->next() = h1_next_next;
	h1_prev->next() = h2_next;
	h2_next->next() = h1;
	h2->next() = h2_next_next;
	h2_prev->next() = h1_next;
	h1_next->next() = h2;

	h1_next->face() = h2->face();
	h2_next->face() = h1->face();

	//showError("flipEdge() not implemented.");
	return e0;
}